

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_ryg_dxt.cpp
# Opt level: O2

sU16 __thiscall ryg_dxt::Pixel::As16Bit(Pixel *this)

{
  int iVar1;
  int iVar2;
  int iVar3;
  
  iVar1 = (uint)(this->field_0).r * 0x1f;
  iVar2 = (uint)(this->field_0).g * 0x3f;
  iVar3 = (uint)(this->field_0).b * 0x1f;
  return (short)((iVar3 + 0x80U >> 8) + iVar3 + 0x80 >> 8) +
         ((ushort)(iVar2 + (iVar2 + 0x80U >> 8) + 0x80 >> 3) & 0xfe0) +
         ((short)iVar1 + (short)((uint)(iVar1 + 0x80) >> 8) + 0x80U & 0x7f00) * 8;
}

Assistant:

sU16 As16Bit() const {
    return (Mul8Bit(r, 31) << 11) + (Mul8Bit(g, 63) << 5) + Mul8Bit(b, 31);
  }